

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  int iVar1;
  SQInteger SVar2;
  char *pcVar3;
  sqvector<char> *in_RDI;
  bool bVar4;
  SQChar *unaff_retaddr;
  SQLexer *in_stack_00000008;
  SQInteger res;
  char *in_stack_ffffffffffffffc8;
  SQLexer *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdf;
  sqvector<char> *len;
  
  len = in_RDI;
  sqvector<char>::resize
            (in_RDI,CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8),
             (char *)in_stack_ffffffffffffffd0);
  do {
    sqvector<char>::push_back((sqvector<char> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
    ;
    Next(in_stack_ffffffffffffffd0);
    in_RDI[2]._vals = in_RDI[2]._vals + 1;
    iVar1 = isalnum((uint)*(byte *)&in_RDI[4]._vals);
    bVar4 = true;
    if (iVar1 == 0) {
      bVar4 = *(char *)&in_RDI[4]._vals == '_';
    }
  } while (bVar4);
  sqvector<char>::push_back((sqvector<char> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sqvector<char>::operator[]((sqvector<char> *)&in_RDI[4]._allocated,0);
  sqvector<char>::size((sqvector<char> *)&in_RDI[4]._allocated);
  SVar2 = GetIDType(in_stack_00000008,unaff_retaddr,(SQInteger)len);
  if ((SVar2 == 0x102) || (SVar2 == 0x136)) {
    pcVar3 = sqvector<char>::operator[]((sqvector<char> *)&in_RDI[4]._allocated,0);
    in_RDI[2]._size = (SQUnsignedInteger)pcVar3;
  }
  return SVar2;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(scisalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        _svalue = &_longstr[0];
    }
    return res;
}